

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_support_format_7zip(archive *_a)

{
  int iVar1;
  void *__ptr;
  _func_int64_t_archive_read_ptr_int64_t_int *unaff_RBX;
  archive *in_RDI;
  _func_int_archive_read_ptr *unaff_R14;
  _func_int_archive_read_ptr *unaff_retaddr;
  _func_int_archive_read_ptr *in_stack_00000008;
  int magic_test;
  int r;
  _7zip_conflict *zip;
  archive_read *a;
  undefined4 in_stack_ffffffffffffffcc;
  archive *read_data;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  read_data = in_RDI;
  iVar1 = __archive_check_magic(_a,a._4_4_,(uint)a,(char *)zip);
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    __ptr = calloc(1,0x50a8);
    if (__ptr == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate 7zip data");
      iVar1 = -0x1e;
    }
    else {
      *(undefined4 *)((long)__ptr + 0x50a0) = 0xffffffff;
      iVar1 = __archive_read_register_format
                        ((archive_read *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                         archive_read_format_7zip_has_encrypted_entries,
                         (char *)archive_read_support_format_7zip_capabilities,
                         archive_read_format_7zip_cleanup,
                         (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                         archive_read_format_7zip_read_data_skip,
                         (_func_int_archive_read_ptr_void_ptr_ptr_size_t_ptr_int64_t_ptr *)read_data
                         ,(_func_int_archive_read_ptr *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),unaff_RBX,
                         unaff_R14,unaff_retaddr,in_stack_00000008);
      if (iVar1 != 0) {
        free(__ptr);
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
archive_read_support_format_7zip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct _7zip *zip;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_7zip");

	zip = calloc(1, sizeof(*zip));
	if (zip == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate 7zip data");
		return (ARCHIVE_FATAL);
	}

	/*
	 * Until enough data has been read, we cannot tell about
	 * any encrypted entries yet.
	 */
	zip->has_encrypted_entries = ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;


	r = __archive_read_register_format(a,
	    zip,
	    "7zip",
	    archive_read_format_7zip_bid,
	    NULL,
	    archive_read_format_7zip_read_header,
	    archive_read_format_7zip_read_data,
	    archive_read_format_7zip_read_data_skip,
	    NULL,
	    archive_read_format_7zip_cleanup,
	    archive_read_support_format_7zip_capabilities,
	    archive_read_format_7zip_has_encrypted_entries);

	if (r != ARCHIVE_OK)
		free(zip);
	return (ARCHIVE_OK);
}